

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::NewCommand(UCIAdapter *this,char *params)

{
  byte *pbVar1;
  size_t sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  bool bVar9;
  char *move;
  Output local_40;
  Output local_38;
  
  sVar2 = DAT_001b6788;
  if ((params == (char *)0x0 || DAT_001b6788 == 0) ||
     (iVar5 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788), iVar5 != 0)) {
    bVar9 = false;
  }
  else {
    pp_Var7 = (_func_int **)(params + sVar2);
    cVar3 = params[sVar2];
    uVar6 = (uint)cVar3;
    if (uVar6 != 0) {
      iVar5 = isspace(uVar6);
      bVar9 = iVar5 != 0;
      if (bVar9) {
        params = (char *)pp_Var7;
      }
      if (!bVar9 || cVar3 == '\0') goto LAB_00134fb3;
      do {
        iVar5 = isspace((int)(char)uVar6);
        if (iVar5 == 0) break;
        pbVar1 = (byte *)((long)pp_Var7 + 1);
        uVar6 = (uint)*pbVar1;
        pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
      } while (*pbVar1 != 0);
    }
    bVar9 = true;
    params = (char *)pp_Var7;
  }
LAB_00134fb3:
  if (bVar9) {
    Output::Output(&local_40,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::New_abi_cxx11_,DAT_001b6808);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::StartPos_abi_cxx11_,DAT_001b6928);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::Fen_abi_cxx11_,DAT_001b6748);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," <fen_string>] [",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::Moves_abi_cxx11_,DAT_001b67c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," <movelist>]",0xc);
    Output::~Output(&local_40);
    Output::Output(&local_40,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Clear search data, set position, and apply <movelist>.",0x36);
    Output::~Output(&local_40);
    Output::Output(&local_40,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"If no position is specified ",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::StartPos_abi_cxx11_,DAT_001b6928);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is assumed.",0xc);
    Output::~Output(&local_40);
    return;
  }
  UCINewGameCommand(this,"");
  sVar2 = DAT_001b6928;
  if (((_func_int **)params != (_func_int **)0x0) && (*params != '\0')) {
    if ((DAT_001b6928 == 0) ||
       (iVar5 = strncmp(params,token::StartPos_abi_cxx11_,DAT_001b6928), iVar5 != 0)) {
      bVar9 = false;
    }
    else {
      pp_Var7 = (_func_int **)((long)params + sVar2);
      cVar3 = *(char *)((long)params + sVar2);
      uVar6 = (uint)cVar3;
      if (uVar6 != 0) {
        iVar5 = isspace(uVar6);
        bVar9 = iVar5 != 0;
        if (bVar9) {
          params = (char *)pp_Var7;
        }
        if (!bVar9 || cVar3 == '\0') goto LAB_0013518f;
        do {
          iVar5 = isspace((int)(char)uVar6);
          if (iVar5 == 0) break;
          pbVar1 = (byte *)((long)pp_Var7 + 1);
          uVar6 = (uint)*pbVar1;
          pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
        } while (*pbVar1 != 0);
      }
      bVar9 = true;
      params = (char *)pp_Var7;
    }
LAB_0013518f:
    sVar2 = DAT_001b67c8;
    if (!bVar9) {
      if ((DAT_001b67c8 == 0) ||
         (iVar5 = strncmp(params,token::Moves_abi_cxx11_,DAT_001b67c8), iVar5 != 0)) {
        bVar9 = false;
      }
      else {
        pp_Var7 = (_func_int **)((long)params + sVar2);
        cVar3 = *(char *)((long)params + sVar2);
        uVar6 = (uint)cVar3;
        if (uVar6 != 0) {
          iVar5 = isspace(uVar6);
          bVar9 = iVar5 != 0;
          if (bVar9) {
            params = (char *)pp_Var7;
          }
          if (!bVar9 || cVar3 == '\0') goto LAB_001351bb;
          do {
            iVar5 = isspace((int)(char)uVar6);
            if (iVar5 == 0) break;
            pbVar1 = (byte *)((long)pp_Var7 + 1);
            uVar6 = (uint)*pbVar1;
            pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
          } while (*pbVar1 != 0);
        }
        bVar9 = true;
        params = (char *)pp_Var7;
      }
LAB_001351bb:
      sVar2 = DAT_001b6748;
      if (!bVar9) {
        pp_Var7 = (_func_int **)params;
        if ((DAT_001b6748 != 0) &&
           (iVar5 = strncmp(params,token::Fen_abi_cxx11_,DAT_001b6748), iVar5 == 0)) {
          pp_Var8 = (_func_int **)((long)params + sVar2);
          cVar3 = *(char *)((long)params + sVar2);
          uVar6 = (uint)cVar3;
          pp_Var7 = pp_Var8;
          if (uVar6 != 0) {
            iVar5 = isspace(uVar6);
            if (iVar5 != 0) {
              params = (char *)pp_Var8;
            }
            pp_Var7 = (_func_int **)params;
            if (iVar5 != 0 && cVar3 != '\0') {
              do {
                iVar5 = isspace((int)(char)uVar6);
                pp_Var7 = pp_Var8;
                if (iVar5 == 0) break;
                pbVar1 = (byte *)((long)pp_Var8 + 1);
                uVar6 = (uint)*pbVar1;
                pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
                pp_Var7 = pp_Var8;
              } while (*pbVar1 != 0);
            }
          }
        }
        iVar5 = (*this->engine->_vptr_ChessEngine[9])(this->engine,pp_Var7);
        pp_Var7 = (_func_int **)CONCAT44(extraout_var_01,iVar5);
        params = (char *)pp_Var7;
        goto LAB_001351d7;
      }
    }
  }
  iVar5 = (*this->engine->_vptr_ChessEngine[9])(this->engine,ChessEngine::_STARTPOS);
  pp_Var7 = (_func_int **)CONCAT44(extraout_var,iVar5);
LAB_001351d7:
  sVar2 = DAT_001b67c8;
  if (pp_Var7 != (_func_int **)0x0) {
    pp_Var7 = (_func_int **)params;
    if (((DAT_001b67c8 != 0) && ((_func_int **)params != (_func_int **)0x0)) &&
       (iVar5 = strncmp(params,token::Moves_abi_cxx11_,DAT_001b67c8), iVar5 == 0)) {
      pp_Var8 = (_func_int **)((long)params + sVar2);
      cVar3 = *(char *)((long)params + sVar2);
      uVar6 = (uint)cVar3;
      pp_Var7 = pp_Var8;
      if (uVar6 != 0) {
        iVar5 = isspace(uVar6);
        if (iVar5 != 0) {
          params = (char *)pp_Var8;
        }
        pp_Var7 = (_func_int **)params;
        if (iVar5 != 0 && cVar3 != '\0') {
          do {
            iVar5 = isspace((int)(char)uVar6);
            pp_Var7 = pp_Var8;
            if (iVar5 == 0) break;
            pbVar1 = (byte *)((long)pp_Var8 + 1);
            uVar6 = (uint)*pbVar1;
            pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
            pp_Var7 = pp_Var8;
          } while (*pbVar1 != 0);
        }
      }
    }
    if (pp_Var7 != (_func_int **)0x0) {
      while( true ) {
        if (pp_Var7 != (_func_int **)0x0) {
          cVar3 = *(char *)pp_Var7;
          while ((cVar3 != '\0' && (iVar5 = isspace((int)cVar3), iVar5 != 0))) {
            cVar3 = *(char *)((long)pp_Var7 + 1);
            pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
          }
        }
        if (*(char *)pp_Var7 == '\0') break;
        local_40._vptr_Output = pp_Var7;
        bVar4 = IsMove((char *)pp_Var7);
        bVar9 = true;
        if (bVar4) {
          iVar5 = (*this->engine->_vptr_ChessEngine[10])(this->engine,pp_Var7);
          pp_Var7 = (_func_int **)CONCAT44(extraout_var_00,iVar5);
          if (pp_Var7 == (_func_int **)0x0) {
            Output::Output(&local_38,InfoPrefix);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Invalid move: ",0xe);
            Output::operator<<(&local_38,(char **)&local_40);
            Output::~Output(&local_38);
          }
          else {
            bVar9 = false;
          }
        }
        if ((bVar9) || (pp_Var7 == (_func_int **)0x0)) break;
      }
    }
    if (ChessEngine::_debug == '\x01') {
      (*this->engine->_vptr_ChessEngine[0xc])();
    }
  }
  return;
}

Assistant:

void UCIAdapter::NewCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::New << " [" << token::StartPos << "|"
             << token::Fen << " <fen_string>] [" << token::Moves
             << " <movelist>]";
    Output() << "Clear search data, set position, and apply <movelist>.";
    Output() << "If no position is specified " << token::StartPos
             << " is assumed.";
    return;
  }

  UCINewGameCommand("");

  if (!params || !*params ||
      ParamMatch(token::StartPos, params) ||
      ParamMatch(token::Moves, params))
  {
    if (!engine->SetPosition(ChessEngine::_STARTPOS)) {
      return;
    }
  }
  else {
    ParamMatch(token::Fen, params); // simply consume "fen" token if it present
    if (!(params = engine->SetPosition(params))) {
      return;
    }
  }

  // simply consume "moves" token if present
  ParamMatch(token::Moves, params);

  // apply moves (if any)
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move)) {
      break;
    }
    if (!(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      break;
    }
  }

  if (engine->IsDebugOn()) {
    engine->PrintBoard();
  }
}